

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_intersection.c
# Opt level: O0

int array_run_container_intersection_cardinality(array_container_t *src_1,run_container_t *src_2)

{
  ushort uVar1;
  _Bool _Var2;
  run_container_t *in_RSI;
  int *in_RDI;
  uint16_t arrayval;
  int32_t newcard;
  rle16_t rle;
  int32_t arraypos;
  int32_t rlepos;
  int local_28;
  rle16_t local_24;
  int local_20;
  int local_1c;
  int local_4;
  
  _Var2 = run_container_is_full(in_RSI);
  if (_Var2) {
    local_4 = *in_RDI;
  }
  else if (in_RSI->n_runs == 0) {
    local_4 = 0;
  }
  else {
    local_1c = 0;
    local_20 = 0;
    local_24 = *in_RSI->runs;
    local_28 = 0;
    while (local_20 < *in_RDI) {
      uVar1 = *(ushort *)(*(long *)(in_RDI + 2) + (long)local_20 * 2);
      while (((uint)local_24 & 0xffff) + ((uint)local_24 >> 0x10) < (uint)uVar1) {
        local_1c = local_1c + 1;
        if (local_1c == in_RSI->n_runs) {
          return local_28;
        }
        local_24 = in_RSI->runs[local_1c];
      }
      if ((uint)uVar1 < ((uint)local_24 & 0xffff)) {
        local_20 = advanceUntil(*(uint16_t **)(in_RDI + 2),local_20,*in_RDI,local_24.value);
      }
      else {
        local_28 = local_28 + 1;
        local_20 = local_20 + 1;
      }
    }
    local_4 = local_28;
  }
  return local_4;
}

Assistant:

int array_run_container_intersection_cardinality(const array_container_t *src_1,
                                                 const run_container_t *src_2) {
    if (run_container_is_full(src_2)) {
        return src_1->cardinality;
    }
    if (src_2->n_runs == 0) {
        return 0;
    }
    int32_t rlepos = 0;
    int32_t arraypos = 0;
    rle16_t rle = src_2->runs[rlepos];
    int32_t newcard = 0;
    while (arraypos < src_1->cardinality) {
        const uint16_t arrayval = src_1->array[arraypos];
        while (rle.value + rle.length <
               arrayval) {  // this will frequently be false
            ++rlepos;
            if (rlepos == src_2->n_runs) {
                return newcard;  // we are done
            }
            rle = src_2->runs[rlepos];
        }
        if (rle.value > arrayval) {
            arraypos = advanceUntil(src_1->array, arraypos, src_1->cardinality,
                                    rle.value);
        } else {
            newcard++;
            arraypos++;
        }
    }
    return newcard;
}